

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrefcnt.cpp
# Opt level: O1

void __thiscall CVmWeakRefable::release_ref(CVmWeakRefable *this)

{
  OS_Counter *pOVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mu->h);
  LOCK();
  pOVar1 = &(this->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
  UNLOCK();
  if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
    if (this->weakref != (CVmWeakRef *)0x0) {
      this->weakref->ref_ = (CVmWeakRefable *)0x0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mu->h);
    (*(this->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])(this);
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mu->h);
  return;
}

Assistant:

void CVmWeakRefable::release_ref()
{
    /* lock the object while we're working */
    mu->lock();
    
    /* decrement the reference counter */
    int del = FALSE;
    if (cnt.dec() == 0)
    {
        /* if we have a weak referencer, clear its pointer to me */
        if (weakref != 0)
            weakref->clear_ref();
        
        /* note that it's time to delete the object */
        del = TRUE;
    }
    
    /* done with our lock */
    mu->unlock();
    
    /* if we're unreferenced, delete myself */
    if (del)
        delete this;
}